

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

void __thiscall
Js::NumberFormatPartsBuilder::NumberFormatPartsBuilder
          (NumberFormatPartsBuilder *this,double num,char16 *formatted,charcount_t formattedLength,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this_00;
  undefined4 *puVar4;
  UNumberFormatFields *pUVar5;
  ulong uVar6;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  this->num = num;
  Memory::Recycler::WBSetBit((char *)&this->formatted);
  (this->formatted).ptr = formatted;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->formatted);
  this->formattedLength = formattedLength;
  Memory::Recycler::WBSetBit((char *)&this->sc);
  (this->sc).ptr = scriptContext;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->sc);
  uVar6 = (ulong)formattedLength;
  local_58 = (undefined1  [8])&UNumberFormatFields::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_6708ef9;
  data.filename._0_4_ = 0x90d;
  data.plusSize = uVar6;
  this_00 = Memory::Recycler::TrackAllocInfo(((this->sc).ptr)->recycler,(TrackAllocData *)local_58);
  if (formattedLength == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pUVar5 = (UNumberFormatFields *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00b6b5a1;
      *puVar4 = 0;
    }
    pUVar5 = (UNumberFormatFields *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,uVar6 * 4);
    if (pUVar5 == (UNumberFormatFields *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00b6b5a1:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  Memory::Recycler::WBSetBit((char *)&this->fields);
  (this->fields).ptr = pUVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->fields);
  memset((this->fields).ptr,0xff,uVar6 << 2);
  return;
}

Assistant:

NumberFormatPartsBuilder(double num, const char16 *formatted, charcount_t formattedLength, ScriptContext *scriptContext)
            : num(num)
            , formatted(formatted)
            , formattedLength(formattedLength)
            , sc(scriptContext)
            , fields(RecyclerNewArrayLeaf(sc->GetRecycler(), UNumberFormatFields, formattedLength))
        {
            // this will allow InsertPart to tell what fields have been initialized or not, and will
            // be the value of resulting { type: "literal" } fields in ToPartsArray
            memset(fields, UnsetField, sizeof(UNumberFormatFields) * formattedLength);
        }